

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::ColumnOrder::write(ColumnOrder *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ssize_t sVar4;
  void *__buf_00;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  TProtocol *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint32_t local_14;
  
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker
            ((TOutputRecursionTracker *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  local_14 = duckdb_apache::thrift::protocol::TProtocol::writeStructBegin
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (char *)in_stack_ffffffffffffffa8);
  if (((byte)this->__isset & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (char *)in_stack_ffffffffffffffa8,T_STOP,0x71);
    sVar4 = TypeDefinedOrder::write(&this->TYPE_ORDER,__fd,__buf_00,(ulong)uVar1);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x717de4);
    local_14 = uVar2 + local_14 + uVar1 + (int)sVar4;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldStop((TProtocol *)0x717e1c);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeStructEnd((TProtocol *)0x717e3a);
  uVar3 = uVar2 + local_14 + uVar1;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker
            ((TOutputRecursionTracker *)0x717e5e);
  return (ulong)uVar3;
}

Assistant:

uint32_t ColumnOrder::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("ColumnOrder");

  if (this->__isset.TYPE_ORDER) {
    xfer += oprot->writeFieldBegin("TYPE_ORDER", ::apache::thrift::protocol::T_STRUCT, 1);
    xfer += this->TYPE_ORDER.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}